

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::CertErrorParams2Der::~CertErrorParams2Der(CertErrorParams2Der *this)

{
  CertErrorParams2Der *this_local;
  
  ~CertErrorParams2Der(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

CertErrorParams2Der(const char *name1, der::Input der1, const char *name2,
                      der::Input der2)
      : name1_(name1),
        der1_(BytesAsStringView(der1)),
        name2_(name2),
        der2_(BytesAsStringView(der2)) {}